

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void EDLines::EnumerateRectPoints
               (double sx,double sy,double ex,double ey,int *ptsx,int *ptsy,int *pNoPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_12c;
  double dStack_128;
  int noPoints;
  double ye;
  double ys;
  int y;
  int x;
  double vLen;
  double dy;
  double dx;
  double width;
  double y2;
  double x2;
  double y1;
  double x1;
  int offset;
  int n;
  double vy [4];
  double vx [4];
  double vyTmp [4];
  double vxTmp [4];
  int *pNoPoints_local;
  int *ptsy_local;
  int *ptsx_local;
  double ey_local;
  double ex_local;
  double sy_local;
  double sx_local;
  
  dVar1 = ex - sx;
  dVar2 = ey - sy;
  dVar3 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  dVar1 = dVar1 / dVar3;
  vyTmp[3] = sx - ((dVar2 / dVar3) * 2.0) / 2.0;
  vx[3] = sy + (dVar1 * 2.0) / 2.0;
  vyTmp[0] = ey + (dVar1 * 2.0) / 2.0;
  vyTmp[1] = ey - (dVar1 * 2.0) / 2.0;
  vyTmp[2] = sy - (dVar1 * 2.0) / 2.0;
  if ((ex <= sx) || (ey < sy)) {
    if ((sx < ex) || (ey <= sy)) {
      if ((sx <= ex) || (sy < ey)) {
        x1._0_4_ = 3;
      }
      else {
        x1._0_4_ = 2;
      }
    }
    else {
      x1._0_4_ = 1;
    }
  }
  else {
    x1._0_4_ = 0;
  }
  for (x1._4_4_ = 0; x1._4_4_ < 4; x1._4_4_ = x1._4_4_ + 1) {
    vy[(long)x1._4_4_ + 3] = vyTmp[(long)((x1._0_4_ + x1._4_4_) % 4) + 3];
    *(double *)(&offset + (long)x1._4_4_ * 2) = vx[(long)((x1._0_4_ + x1._4_4_) % 4) + 3];
  }
  dVar1 = ceil(vy[3]);
  ys._4_4_ = (int)dVar1 + -1;
  dVar1 = ceil(_offset);
  ys._0_4_ = (int)dVar1;
  dStack_128 = -1.79769313486232e+308;
  local_12c = 0;
  while( true ) {
    ys._0_4_ = ys._0_4_ + 1;
    while ((dStack_128 < (double)ys._0_4_ && (double)ys._4_4_ <= vx[1] &&
           (ys._4_4_ = ys._4_4_ + 1, (double)ys._4_4_ <= vx[1]))) {
      if (vx[2] <= (double)ys._4_4_) {
        if (0.01 < ABS(vx[2] - vx[1])) {
          ye = vy[2] + (((double)ys._4_4_ - vx[2]) * (vy[1] - vy[2])) / (vx[1] - vx[2]);
        }
        else if (vy[1] <= vy[2]) {
          if (vy[2] <= vy[1]) {
            ye = vy[2] + (((double)ys._4_4_ - vx[2]) * (ey - vy[2])) / (vx[1] - vx[2]);
          }
          else {
            ye = vy[1];
          }
        }
        else {
          ye = vy[2];
        }
      }
      else if (0.01 < ABS(vy[3] - vx[2])) {
        ye = _offset + (((double)ys._4_4_ - vy[3]) * (vy[2] - _offset)) / (vx[2] - vy[3]);
      }
      else if (vy[2] <= _offset) {
        if (_offset <= vy[2]) {
          ye = _offset + (((double)ys._4_4_ - vy[3]) * (vy[2] - _offset)) / (vx[2] - vy[3]);
        }
        else {
          ye = vy[2];
        }
      }
      else {
        ye = _offset;
      }
      if (vx[0] <= (double)ys._4_4_) {
        if (0.01 < ABS(vx[0] - vx[1])) {
          dStack_128 = vy[0] + (((double)ys._4_4_ - vx[0]) * (vy[1] - vy[0])) / (vx[1] - vx[0]);
        }
        else if (vy[1] <= vy[0]) {
          if (vy[0] <= vy[1]) {
            dStack_128 = vy[0] + (((double)ys._4_4_ - vx[0]) * (vy[1] - vy[0])) / (vx[1] - vx[0]);
          }
          else {
            dStack_128 = vy[0];
          }
        }
        else {
          dStack_128 = vy[1];
        }
      }
      else if (0.01 < ABS(vy[3] - vx[0])) {
        dStack_128 = _offset + (((double)ys._4_4_ - vy[3]) * (vy[0] - _offset)) / (vx[0] - vy[3]);
      }
      else if (vy[0] <= _offset) {
        if (_offset <= vy[0]) {
          dStack_128 = _offset + (((double)ys._4_4_ - vy[3]) * (vy[0] - _offset)) / (vx[0] - vy[3]);
        }
        else {
          dStack_128 = _offset;
        }
      }
      else {
        dStack_128 = vy[0];
      }
      dVar1 = ceil(ye);
      ys._0_4_ = (int)dVar1;
    }
    if (vx[1] < (double)ys._4_4_) break;
    ptsx[local_12c] = ys._4_4_;
    ptsy[local_12c] = ys._0_4_;
    local_12c = local_12c + 1;
  }
  *pNoPoints = local_12c;
  return;
}

Assistant:

void EDLines::EnumerateRectPoints(double sx, double sy, double ex, double ey, int ptsx[], int ptsy[], int * pNoPoints)
{
	double vxTmp[4], vyTmp[4];
	double vx[4], vy[4];
	int n, offset;

	double x1 = sx;
	double y1 = sy;
	double x2 = ex;
	double y2 = ey;
	double width = 2;

	double dx = x2 - x1;
	double dy = y2 - y1;
	double vLen = sqrt(dx*dx + dy*dy);

	// make unit vector
	dx = dx / vLen;
	dy = dy / vLen;

	/* build list of rectangle corners ordered
	in a circular way around the rectangle */
	vxTmp[0] = x1 - dy * width / 2.0;
	vyTmp[0] = y1 + dx * width / 2.0;
	vxTmp[1] = x2 - dy * width / 2.0;
	vyTmp[1] = y2 + dx * width / 2.0;
	vxTmp[2] = x2 + dy * width / 2.0;
	vyTmp[2] = y2 - dx * width / 2.0;
	vxTmp[3] = x1 + dy * width / 2.0;
	vyTmp[3] = y1 - dx * width / 2.0;

	/* compute rotation of index of corners needed so that the first
	point has the smaller x.

	if one side is vertical, thus two corners have the same smaller x
	value, the one with the largest y value is selected as the first.
	*/
	if (x1 < x2 && y1 <= y2) offset = 0;
	else if (x1 >= x2 && y1 < y2) offset = 1;
	else if (x1 > x2 && y1 >= y2) offset = 2;
	else                          offset = 3;

	/* apply rotation of index. */
	for (n = 0; n<4; n++) {
		vx[n] = vxTmp[(offset + n) % 4];
		vy[n] = vyTmp[(offset + n) % 4];
	} //end-for

	  /* Set a initial condition.

	  The values are set to values that will cause 'ri_inc' (that will
	  be called immediately) to initialize correctly the first 'column'
	  and compute the limits 'ys' and 'ye'.

	  'y' is set to the integer value of vy[0], the starting corner.

	  'ys' and 'ye' are set to very small values, so 'ri_inc' will
	  notice that it needs to start a new 'column'.

	  The smaller integer coordinate inside of the rectangle is
	  'ceil(vx[0])'. The current 'x' value is set to that value minus
	  one, so 'ri_inc' (that will increase x by one) will advance to
	  the first 'column'.
	  */
	int x = (int)ceil(vx[0]) - 1;
	int y = (int)ceil(vy[0]);
	double ys = -DBL_MAX, ye = -DBL_MAX;

	int noPoints = 0;
	while (1) {
		/* if not at end of exploration,
		increase y value for next pixel in the 'column' */
		y++;

		/* if the end of the current 'column' is reached,
		and it is not the end of exploration,
		advance to the next 'column' */
		while (y > ye && x <= vx[2]) {
			/* increase x, next 'column' */
			x++;

			/* if end of exploration, return */
			if (x > vx[2]) break;

			/* update lower y limit (start) for the new 'column'.

			We need to interpolate the y value that corresponds to the
			lower side of the rectangle. The first thing is to decide if
			the corresponding side is

			vx[0],vy[0] to vx[3],vy[3] or
			vx[3],vy[3] to vx[2],vy[2]

			Then, the side is interpolated for the x value of the
			'column'. But, if the side is vertical (as it could happen if
			the rectangle is vertical and we are dealing with the first
			or last 'columns') then we pick the lower value of the side
			by using 'inter_low'.
			*/
			if ((double)x < vx[3]) {
				/* interpolation */
				if (fabs(vx[0] - vx[3]) <= 0.01) {
					if (vy[0]<vy[3]) ys = vy[0];
					else if (vy[0]>vy[3]) ys = vy[3];
					else     ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);
				}
				else
					ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[3] - vx[2]) <= 0.01) {
					if (vy[3]<vy[2]) ys = vy[3];
					else if (vy[3]>vy[2]) ys = vy[2];
					else     ys = vy[3] + (x - vx[3]) * (y2 - vy[3]) / (vx[2] - vx[3]);
				}
				else
					ys = vy[3] + (x - vx[3]) * (vy[2] - vy[3]) / (vx[2] - vx[3]);
			} //end-else

			  /* update upper y limit (end) for the new 'column'.

			  We need to interpolate the y value that corresponds to the
			  upper side of the rectangle. The first thing is to decide if
			  the corresponding side is

			  vx[0],vy[0] to vx[1],vy[1] or
			  vx[1],vy[1] to vx[2],vy[2]

			  Then, the side is interpolated for the x value of the
			  'column'. But, if the side is vertical (as it could happen if
			  the rectangle is vertical and we are dealing with the first
			  or last 'columns') then we pick the lower value of the side
			  by using 'inter_low'.
			  */
			if ((double)x < vx[1]) {
				/* interpolation */
				if (fabs(vx[0] - vx[1]) <= 0.01) {
					if (vy[0]<vy[1]) ye = vy[1];
					else if (vy[0]>vy[1]) ye = vy[0];
					else     ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);
				}
				else
					ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[1] - vx[2]) <= 0.01) {
					if (vy[1]<vy[2]) ye = vy[2];
					else if (vy[1]>vy[2]) ye = vy[1];
					else     ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
				}
				else
					ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
			} //end-else

			  /* new y */
			y = (int)ceil(ys);
		} //end-while

		  // Are we done?
		if (x > vx[2]) break;

		ptsx[noPoints] = x;
		ptsy[noPoints] = y;
		noPoints++;
	} //end-while

	*pNoPoints = noPoints;
}